

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_test.cc
# Opt level: O1

void TestCipherAPI(EVP_CIPHER *cipher,Operation op,bool padding,bool copy,bool in_place,
                  bool use_evp_cipher,size_t chunk_size,Span<const_unsigned_char> key,
                  Span<const_unsigned_char> iv,Span<const_unsigned_char> plaintext,
                  Span<const_unsigned_char> ciphertext,Span<const_unsigned_char> aad,
                  Span<const_unsigned_char> tag)

{
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var1;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  Span<const_unsigned_char> *pSVar7;
  pointer *__ptr;
  AssertHelperData *__n;
  AssertHelperData *pAVar8;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pdVar9;
  undefined1 auVar10 [8];
  undefined7 in_register_00000081;
  char *pcVar11;
  undefined7 in_register_00000089;
  char *pcVar12;
  long lVar13;
  pointer *__ptr_2;
  int len_1;
  int len;
  undefined1 local_f8 [8];
  AssertHelperData *local_f0;
  undefined1 local_e0 [8];
  AssertHelperData *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  undefined1 local_c0 [8];
  AssertHelperData *local_b8;
  undefined1 local_b0 [8];
  AssertHelperData *local_a8;
  pointer local_a0;
  _Head_base<0UL,_evp_cipher_ctx_st_*,_false> local_98;
  byte local_89;
  Bytes local_88;
  int local_74;
  AssertHelper local_70;
  uint local_64;
  undefined4 local_60;
  uint local_5c;
  _Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  AssertHelperData *local_50;
  uint32_t local_48;
  undefined4 local_44;
  AssertHelperData *local_40;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  pcVar12 = (char *)CONCAT71(in_register_00000089,use_evp_cipher);
  local_60 = SUB84(pcVar12,0);
  local_44 = (undefined4)CONCAT71(in_register_00000081,in_place);
  uVar6 = EVP_CIPHER_flags((EVP_CIPHER *)cipher);
  pSVar7 = &ciphertext;
  if (op == kEncrypt) {
    pSVar7 = &plaintext;
  }
  local_58.
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        )pSVar7->data_;
  local_50 = (AssertHelperData *)pSVar7->size_;
  pSVar7 = &plaintext;
  if (op == kEncrypt) {
    pSVar7 = &ciphertext;
  }
  local_38._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )pSVar7->data_;
  local_40 = (AssertHelperData *)pSVar7->size_;
  uVar3 = EVP_CIPHER_mode(cipher);
  local_98._M_head_impl = (evp_cipher_ctx_st *)EVP_CIPHER_CTX_new();
  local_b0[0] = (EVP_CIPHER_CTX *)local_98._M_head_impl != (EVP_CIPHER_CTX *)0x0;
  local_a8 = (AssertHelperData *)0x0;
  if ((EVP_CIPHER_CTX *)local_98._M_head_impl == (EVP_CIPHER_CTX *)0x0) {
    testing::Message::Message((Message *)local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_e0,(internal *)local_b0,(AssertionResult *)0x5423a5,"false","true",
               pcVar12);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x98,(char *)CONCAT71(local_e0._1_7_,local_e0[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c0,(Message *)local_f8);
LAB_002499d7:
    pdVar9 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_a8;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_e0._1_7_,local_e0[0]) != &local_d0) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_e0._1_7_,local_e0[0]),local_d0._M_allocated_capacity + 1);
    }
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_f8 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      (**(code **)(*(long *)local_f8 + 8))();
    }
    local_d8 = local_a8;
    if (local_a8 == (AssertHelperData *)0x0) goto LAB_00249a1d;
  }
  else {
    pcVar12 = (char *)(ulong)(op == kEncrypt);
    iVar4 = EVP_CipherInit_ex((EVP_CIPHER_CTX *)local_98._M_head_impl,(EVP_CIPHER *)cipher,
                              (ENGINE *)0x0,(uchar *)0x0,(uchar *)0x0,(uint)(op == kEncrypt));
    local_b0[0] = iVar4 != 0;
    local_a8 = (AssertHelperData *)0x0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)local_f8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_e0,(internal *)local_b0,
                 (AssertionResult *)
                 "EVP_CipherInit_ex(ctx.get(), cipher, nullptr, nullptr, nullptr, encrypt ? 1 : 0)",
                 "false","true",pcVar12);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x9b,(char *)CONCAT71(local_e0._1_7_,local_e0[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)local_c0,(Message *)local_f8);
      goto LAB_002499d7;
    }
    iVar4 = EVP_CIPHER_CTX_set_key_length((EVP_CIPHER_CTX *)local_98._M_head_impl,(int)key.size_);
    local_b0[0] = iVar4 != 0;
    local_a8 = (AssertHelperData *)0x0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)local_f8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_e0,(internal *)local_b0,
                 (AssertionResult *)"EVP_CIPHER_CTX_set_key_length(ctx.get(), key.size())","false",
                 "true",pcVar12);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x9c,(char *)CONCAT71(local_e0._1_7_,local_e0[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)local_c0,(Message *)local_f8);
      goto LAB_002499d7;
    }
    if (!padding) {
      iVar4 = EVP_CIPHER_CTX_set_padding((EVP_CIPHER_CTX *)local_98._M_head_impl,0);
      local_b0[0] = iVar4 != 0;
      local_a8 = (AssertHelperData *)0x0;
      if (iVar4 == 0) {
        testing::Message::Message((Message *)local_f8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_e0,(internal *)local_b0,
                   (AssertionResult *)"EVP_CIPHER_CTX_set_padding(ctx.get(), 0)","false","true",
                   pcVar12);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_c0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                   ,0x9e,(char *)CONCAT71(local_e0._1_7_,local_e0[0]));
        testing::internal::AssertHelper::operator=((AssertHelper *)local_c0,(Message *)local_f8);
        goto LAB_002499d7;
      }
    }
    local_a8 = (AssertHelperData *)0x0;
    local_5c = (uint)copy;
    bVar2 = MaybeCopyCipherContext(copy,(UniquePtr<EVP_CIPHER_CTX> *)&local_98);
    local_b0[0] = bVar2;
    local_a8 = (AssertHelperData *)0x0;
    if (!bVar2) {
      testing::Message::Message((Message *)local_f8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_e0,(internal *)local_b0,
                 (AssertionResult *)"MaybeCopyCipherContext(copy, &ctx)","false","true",pcVar12);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0xa2,(char *)CONCAT71(local_e0._1_7_,local_e0[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)local_c0,(Message *)local_f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_e0._1_7_,local_e0[0]) != &local_d0) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_e0._1_7_,local_e0[0]),local_d0._M_allocated_capacity + 1);
      }
      if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )local_f8 !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_f8 + 8))();
      }
      if (local_a8 != (AssertHelperData *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
      }
      if (!bVar2) goto LAB_00249a1d;
    }
    pcVar12 = &DAT_ffffffff;
    iVar4 = EVP_CipherInit_ex((EVP_CIPHER_CTX *)local_98._M_head_impl,(EVP_CIPHER *)0x0,
                              (ENGINE *)0x0,key.data_,(uchar *)0x0,-1);
    local_b0[0] = iVar4 != 0;
    local_a8 = (AssertHelperData *)0x0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)local_f8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_e0,(internal *)local_b0,
                 (AssertionResult *)
                 "EVP_CipherInit_ex(ctx.get(), nullptr, nullptr, key.data(), nullptr, -1)","false",
                 "true",pcVar12);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0xa5,(char *)CONCAT71(local_e0._1_7_,local_e0[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)local_c0,(Message *)local_f8);
      goto LAB_002499d7;
    }
    bVar2 = MaybeCopyCipherContext(SUB41(local_5c,0),(UniquePtr<EVP_CIPHER_CTX> *)&local_98);
    local_b0[0] = bVar2;
    local_a8 = (AssertHelperData *)0x0;
    if (!bVar2) {
      testing::Message::Message((Message *)local_f8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_e0,(internal *)local_b0,
                 (AssertionResult *)"MaybeCopyCipherContext(copy, &ctx)","false","true",pcVar12);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0xab,(char *)CONCAT71(local_e0._1_7_,local_e0[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)local_c0,(Message *)local_f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_e0._1_7_,local_e0[0]) != &local_d0) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_e0._1_7_,local_e0[0]),local_d0._M_allocated_capacity + 1);
      }
      if (local_f8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_f8 + 8))();
      }
      if (local_a8 != (AssertHelperData *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
      }
      if (!bVar2) goto LAB_00249a1d;
    }
    if (uVar3 == 6) {
      local_b0 = (undefined1  [8])iv.size_;
      local_f8 = (undefined1  [8])0x7fffffff;
      testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
                ((internal *)local_e0,"iv.size()","size_t{2147483647}",(unsigned_long *)local_b0,
                 (unsigned_long *)local_f8);
      if (local_e0[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_b0);
        if (local_d8 == (AssertHelperData *)0x0) {
          pcVar12 = "";
        }
        else {
          pcVar12 = *(char **)local_d8;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_f8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                   ,0xad,pcVar12);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_f8,(Message *)local_b0);
      }
      else {
        if (local_d8 != (AssertHelperData *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8
                      );
        }
        iVar4 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)local_98._M_head_impl,9,(int)iv.size_,
                                    (void *)0x0);
        local_b0[0] = iVar4 != 0;
        local_a8 = (AssertHelperData *)0x0;
        if (iVar4 == 0) {
          testing::Message::Message((Message *)local_f8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_e0,(internal *)local_b0,
                     (AssertionResult *)
                     "EVP_CIPHER_CTX_ctrl(ctx.get(), 0x9, static_cast<int>(iv.size()), nullptr)",
                     "false","true",pcVar12);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_c0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                     ,0xaf,(char *)CONCAT71(local_e0._1_7_,local_e0[0]));
          testing::internal::AssertHelper::operator=((AssertHelper *)local_c0,(Message *)local_f8);
          goto LAB_002499d7;
        }
        iVar4 = EVP_CIPHER_CTX_iv_length((EVP_CIPHER_CTX *)local_98._M_head_impl);
        local_f8._0_4_ = iVar4;
        local_b0 = (undefined1  [8])iv.size_;
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                  ((internal *)local_e0,"EVP_CIPHER_CTX_iv_length(ctx.get())","iv.size()",
                   (uint *)local_f8,(unsigned_long *)local_b0);
        if (local_e0[0] != (internal)0x0) goto LAB_00249aee;
        testing::Message::Message((Message *)local_b0);
        if (local_d8 == (AssertHelperData *)0x0) {
          pcVar12 = "";
        }
        else {
          pcVar12 = *(char **)local_d8;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_f8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                   ,0xb0,pcVar12);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_f8,(Message *)local_b0);
      }
    }
    else {
      local_b0 = (undefined1  [8])iv.size_;
      local_f8._0_4_ = EVP_CIPHER_CTX_iv_length((EVP_CIPHER_CTX *)local_98._M_head_impl);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                ((internal *)local_e0,"iv.size()","EVP_CIPHER_CTX_iv_length(ctx.get())",
                 (unsigned_long *)local_b0,(uint *)local_f8);
      if (local_e0[0] != (internal)0x0) {
LAB_00249aee:
        if (local_d8 != (AssertHelperData *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8
                      );
        }
        pcVar12 = &DAT_ffffffff;
        iVar4 = EVP_CipherInit_ex((EVP_CIPHER_CTX *)local_98._M_head_impl,(EVP_CIPHER *)0x0,
                                  (ENGINE *)0x0,(uchar *)0x0,iv.data_,-1);
        local_b0[0] = iVar4 != 0;
        local_a8 = (AssertHelperData *)0x0;
        if (iVar4 != 0) {
          if (op != kEncrypt && uVar3 == 6) {
            iVar4 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)local_98._M_head_impl,0x11,(int)tag.size_,
                                        tag.data_);
            local_b0[0] = iVar4 != 0;
            local_a8 = (AssertHelperData *)0x0;
            if (iVar4 == 0) {
              testing::Message::Message((Message *)local_f8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_e0,(internal *)local_b0,
                         (AssertionResult *)
                         "EVP_CIPHER_CTX_ctrl(ctx.get(), 0x11, tag.size(), const_cast<uint8_t *>(tag.data()))"
                         ,"false","true",pcVar12);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_c0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                         ,0xbb,(char *)CONCAT71(local_e0._1_7_,local_e0[0]));
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_c0,(Message *)local_f8);
              goto LAB_002499d7;
            }
          }
          local_a8 = (AssertHelperData *)0x0;
          uVar6 = uVar6 >> 10 & 0x3fffff;
          local_64 = (uint)uVar6;
          local_89 = (byte)uVar6 & 1;
          local_48 = uVar3;
          _Var1._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0;
          for (; local_b0 = (undefined1  [8])_Var1._M_head_impl, aad.size_ != 0;
              aad.size_ = aad.size_ - uVar6) {
            uVar6 = chunk_size;
            if (aad.size_ < chunk_size) {
              uVar6 = aad.size_;
            }
            if (chunk_size == 0) {
              uVar6 = aad.size_;
            }
            uVar5 = (uint)uVar6;
            if ((char)local_60 == '\0') {
              iVar4 = EVP_CipherUpdate((EVP_CIPHER_CTX *)local_98._M_head_impl,(uchar *)0x0,
                                       (int *)&local_88,aad.data_,uVar5);
              auVar10 = local_b0;
              local_b0[0] = iVar4 != 0;
              local_a8 = (AssertHelperData *)0x0;
              if (iVar4 == 0) {
                testing::Message::Message((Message *)local_f8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_e0,(internal *)local_b0,
                           (AssertionResult *)
                           "EVP_CipherUpdate(ctx.get(), nullptr, &len, aad.data(), todo)","false",
                           "true",pcVar12);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_c0,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                           ,0xcc,(char *)CONCAT71(local_e0._1_7_,local_e0[0]));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_c0,(Message *)local_f8);
                goto LAB_0024a619;
              }
              local_b0._4_4_ = auVar10._4_4_;
              local_b0._0_4_ = uVar5;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)local_e0,"len","static_cast<int>(todo)",(int *)&local_88,
                         (int *)local_b0);
              if (local_e0[0] == (internal)0x0) {
                testing::Message::Message((Message *)local_b0);
                pcVar11 = "";
                if (local_d8 != (AssertHelperData *)0x0) {
                  pcVar11 = *(char **)local_d8;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_f8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                           ,0xcf,pcVar11);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_f8,(Message *)local_b0);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_f8);
                if (local_b0 != (undefined1  [8])0x0) {
                  (**(code **)(*(long *)local_b0 + 8))();
                }
              }
              if (local_d8 != (AssertHelperData *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_d8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_d8);
              }
              if (iVar4 == 0) goto LAB_00249a1d;
            }
            else {
              local_b0._1_7_ = (undefined7)((ulong)_Var1._M_head_impl >> 8);
              local_b0[0] = local_89;
              local_a8 = (AssertHelperData *)0x0;
              if ((local_64 & 1) == 0) {
                testing::Message::Message((Message *)local_f8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_e0,(internal *)local_b0,
                           (AssertionResult *)"is_custom_cipher","false","true",pcVar12);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_c0,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                           ,199,(char *)CONCAT71(local_e0._1_7_,local_e0[0]));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_c0,(Message *)local_f8);
LAB_0024a619:
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_e0._1_7_,local_e0[0]) != &local_d0) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT71(local_e0._1_7_,local_e0[0]),
                                  local_d0._M_allocated_capacity + 1);
                }
                if (local_f8 != (undefined1  [8])0x0) {
                  (**(code **)(*(long *)local_f8 + 8))();
                }
                if (local_a8 == (AssertHelperData *)0x0) goto LAB_00249a1d;
                pdVar9 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_a8;
                local_d8 = local_a8;
                goto LAB_00249a18;
              }
              local_b0._4_4_ = (undefined4)((ulong)_Var1._M_head_impl >> 0x20);
              local_b0._0_4_ = uVar5;
              iVar4 = EVP_Cipher((EVP_CIPHER_CTX *)local_98._M_head_impl,(uchar *)0x0,aad.data_,
                                 uVar5);
              local_f8._0_4_ = iVar4;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)local_e0,"static_cast<int>(todo)",
                         "EVP_Cipher(ctx.get(), nullptr, aad.data(), todo)",(int *)local_b0,
                         (int *)local_f8);
              if (local_e0[0] == (internal)0x0) {
                testing::Message::Message((Message *)local_b0);
                if (local_d8 == (AssertHelperData *)0x0) {
                  pcVar12 = "";
                }
                else {
                  pcVar12 = *(char **)local_d8;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_f8,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                           ,0xc9,pcVar12);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_f8,(Message *)local_b0);
                goto LAB_0024a4df;
              }
              if (local_d8 != (AssertHelperData *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_d8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_d8);
              }
            }
            aad.data_ = aad.data_ + uVar6;
            _Var1._M_head_impl =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0
            ;
          }
          uVar5 = EVP_CIPHER_CTX_block_size((EVP_CIPHER_CTX *)local_98._M_head_impl);
          pAVar8 = local_50;
          __n = pAVar8;
          if (((1 < uVar5) &&
              (uVar6 = EVP_CIPHER_CTX_flags((EVP_CIPHER_CTX *)local_98._M_head_impl),
              ((uint)uVar6 >> 0xb & 1) == 0)) &&
             (iVar4 = EVP_CIPHER_CTX_encrypting(local_98._M_head_impl), iVar4 != 0)) {
            __n = (AssertHelperData *)((long)pAVar8 + ((ulong)uVar5 - (ulong)pAVar8 % (ulong)uVar5))
            ;
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0,
                     (size_type)__n,(allocator_type *)local_e0);
          if ((char)local_44 != '\0') {
            if (pAVar8 != (AssertHelperData *)0x0) {
              memmove((void *)local_b0,
                      (void *)local_58.
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl,(size_t)pAVar8);
            }
            local_58.
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  )(_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    )local_b0;
            if ((AssertHelperData *)((long)local_a8 - (long)local_b0) < pAVar8) {
LAB_0024addd:
              abort();
            }
          }
          lVar13 = 0;
          do {
            auVar10 = local_f8;
            if (local_50 == (AssertHelperData *)0x0) {
              if (op == kInvalidDecrypt) {
                if ((char)local_60 != '\0') {
                  local_f8[0] = local_89;
                  local_f0 = (AssertHelperData *)0x0;
                  if ((local_64 & 1) == 0) {
                    testing::Message::Message((Message *)local_c0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_e0,(internal *)local_f8,
                               (AssertionResult *)"is_custom_cipher","false","true",pcVar12);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_88,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                               ,0xfe,(char *)CONCAT71(local_e0._1_7_,local_e0[0]));
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_88,(Message *)local_c0);
                    goto LAB_0024a861;
                  }
                  local_f8._4_4_ = auVar10._4_4_;
                  local_f8._0_4_ = 0xffffffff;
                  iVar4 = EVP_Cipher((EVP_CIPHER_CTX *)local_98._M_head_impl,(uchar *)0x0,
                                     (uchar *)0x0,0);
                  local_c0._0_4_ = iVar4;
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)local_e0,"-1","EVP_Cipher(ctx.get(), nullptr, nullptr, 0)",
                             (int *)local_f8,(int *)local_c0);
                  if (local_e0[0] == (internal)0x0) {
                    testing::Message::Message((Message *)local_f8);
                    if (local_d8 == (AssertHelperData *)0x0) {
                      pcVar12 = "";
                    }
                    else {
                      pcVar12 = *(char **)local_d8;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)local_c0,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                               ,0xff,pcVar12);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)local_c0,(Message *)local_f8);
                    goto LAB_0024ac6a;
                  }
                  goto LAB_0024ac83;
                }
                iVar4 = EVP_CipherFinal_ex((EVP_CIPHER_CTX *)local_98._M_head_impl,
                                           (uchar *)((long)local_b0 + lVar13),&local_74);
                local_f8[0] = iVar4 == 0;
                local_f0 = (AssertHelperData *)0x0;
                if (iVar4 != 0) {
                  testing::Message::Message((Message *)local_c0);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_e0,(internal *)local_f8,
                             (AssertionResult *)
                             "EVP_CipherFinal_ex(ctx.get(), result.data() + total, &len)","true",
                             "false",pcVar12);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_88,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                             ,0x103,(char *)CONCAT71(local_e0._1_7_,local_e0[0]));
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_88,(Message *)local_c0);
LAB_0024a861:
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_e0._1_7_,local_e0[0]) != &local_d0) {
                    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)CONCAT71(local_e0._1_7_,local_e0[0]),
                                    local_d0._M_allocated_capacity + 1);
                  }
                  if (local_c0 != (undefined1  [8])0x0) {
                    (**(code **)(*(long *)local_c0 + 8))();
                  }
                }
                pdVar9 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_f0;
                local_d8 = local_f0;
LAB_0024a89c:
                if (local_d8 == (AssertHelperData *)0x0) break;
              }
              else {
                if ((char)local_60 == '\0') {
                  iVar4 = EVP_CipherFinal_ex((EVP_CIPHER_CTX *)local_98._M_head_impl,
                                             (uchar *)((long)local_b0 + lVar13),&local_74);
                  local_f8[0] = iVar4 != 0;
                  local_f0 = (AssertHelperData *)0x0;
                  if (iVar4 == 0) {
                    testing::Message::Message((Message *)local_c0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_e0,(internal *)local_f8,
                               (AssertionResult *)
                               "EVP_CipherFinal_ex(ctx.get(), result.data() + total, &len)","false",
                               "true",pcVar12);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_88,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                               ,0x10f,(char *)CONCAT71(local_e0._1_7_,local_e0[0]));
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_88,(Message *)local_c0);
                    goto LAB_0024a861;
                  }
                }
                else if ((local_64 & 1) == 0) {
                  local_74 = 0;
                }
                else {
                  local_74 = EVP_Cipher((EVP_CIPHER_CTX *)local_98._M_head_impl,(uchar *)0x0,
                                        (uchar *)0x0,0);
                }
                local_f8 = (undefined1  [8])((ulong)local_f8 & 0xffffffff00000000);
                testing::internal::CmpHelperGE<int,int>
                          ((internal *)local_e0,"len","0",&local_74,(int *)local_f8);
                if (local_e0[0] == (internal)0x0) {
                  testing::Message::Message((Message *)local_f8);
                  if (local_d8 == (AssertHelperData *)0x0) {
                    pcVar12 = "";
                  }
                  else {
                    pcVar12 = *(char **)local_d8;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)local_c0,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                             ,0x111,pcVar12);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)local_c0,(Message *)local_f8);
LAB_0024ac6a:
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c0);
                  auVar10 = local_f8;
                }
                else {
                  if (local_d8 != (AssertHelperData *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_d8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_d8);
                  }
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0,
                             lVar13 + local_74);
                  local_f8 = (undefined1  [8])
                             local_38._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
                  local_f0 = local_40;
                  local_b8 = (AssertHelperData *)((long)local_a8 - (long)local_b0);
                  local_c0 = local_b0;
                  testing::internal::CmpHelperEQ<Bytes,Bytes>
                            ((internal *)local_e0,"Bytes(expected)","Bytes(result)",
                             (Bytes *)local_f8,(Bytes *)local_c0);
                  if (local_e0[0] == (internal)0x0) {
                    testing::Message::Message((Message *)local_f8);
                    if (local_d8 == (AssertHelperData *)0x0) {
                      pcVar11 = "";
                    }
                    else {
                      pcVar11 = *(char **)local_d8;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)local_c0,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                               ,0x114,pcVar11);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)local_c0,(Message *)local_f8);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c0);
                    if (local_f8 != (undefined1  [8])0x0) {
                      (**(code **)(*(long *)local_f8 + 8))();
                    }
                  }
                  if (local_d8 != (AssertHelperData *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_d8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_d8);
                  }
                  if (op != kEncrypt || local_48 != 6) break;
                  pAVar8 = (AssertHelperData *)tag.size_;
                  local_88.span_.data_ = &DAT_00000010;
                  local_c0 = (undefined1  [8])pAVar8;
                  testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
                            ((internal *)local_e0,"tag.size()","sizeof(rtag)",
                             (unsigned_long *)local_c0,(unsigned_long *)&local_88);
                  if (local_e0[0] == (internal)0x0) {
                    testing::Message::Message((Message *)local_c0);
                    if (local_d8 == (AssertHelperData *)0x0) {
                      pcVar12 = "";
                    }
                    else {
                      pcVar12 = *(char **)local_d8;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_88,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                               ,0x117,pcVar12);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_88,(Message *)local_c0);
                  }
                  else {
                    if (local_d8 != (AssertHelperData *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_d8,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_d8);
                    }
                    bVar2 = MaybeCopyCipherContext
                                      (SUB41(local_5c,0),(UniquePtr<EVP_CIPHER_CTX> *)&local_98);
                    local_c0[0] = bVar2;
                    local_b8 = (AssertHelperData *)0x0;
                    if (!bVar2) {
                      testing::Message::Message((Message *)&local_88);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)local_e0,(internal *)local_c0,
                                 (AssertionResult *)"MaybeCopyCipherContext(copy, &ctx)","false",
                                 "true",pcVar12);
                      testing::internal::AssertHelper::AssertHelper
                                (&local_70,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                                 ,0x118,(char *)CONCAT71(local_e0._1_7_,local_e0[0]));
                      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_88);
                      testing::internal::AssertHelper::~AssertHelper(&local_70);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_e0._1_7_,local_e0[0]) != &local_d0) {
                        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)CONCAT71(local_e0._1_7_,local_e0[0]),
                                        local_d0._M_allocated_capacity + 1);
                      }
                      if ((long *)local_88.span_.data_ != (long *)0x0) {
                        (**(code **)(*(long *)local_88.span_.data_ + 8))();
                      }
                      if (local_b8 != (AssertHelperData *)0x0) {
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_b8,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_b8);
                      }
                      if (!bVar2) break;
                    }
                    iVar4 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)local_98._M_head_impl,0x10,
                                                (int)tag.size_,local_f8);
                    local_c0[0] = iVar4 != 0;
                    local_b8 = (AssertHelperData *)0x0;
                    if (iVar4 == 0) {
                      pdVar9 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_b8;
                      testing::Message::Message((Message *)&local_88);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)local_e0,(internal *)local_c0,
                                 (AssertionResult *)
                                 "EVP_CIPHER_CTX_ctrl(ctx.get(), 0x10, tag.size(), rtag)","false",
                                 "true",pcVar12);
                      testing::internal::AssertHelper::AssertHelper
                                (&local_70,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                                 ,0x11a,(char *)CONCAT71(local_e0._1_7_,local_e0[0]));
                      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_88);
                      testing::internal::AssertHelper::~AssertHelper(&local_70);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_e0._1_7_,local_e0[0]) != &local_d0) {
                        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)CONCAT71(local_e0._1_7_,local_e0[0]),
                                        local_d0._M_allocated_capacity + 1);
                      }
                      local_d8 = local_b8;
                      if ((long *)local_88.span_.data_ != (long *)0x0) {
                        (**(code **)(*(long *)local_88.span_.data_ + 8))();
                        local_d8 = local_b8;
                      }
                      goto LAB_0024a89c;
                    }
                    local_c0 = (undefined1  [8])tag.data_;
                    local_b8 = pAVar8;
                    local_88.span_.data_ = local_f8;
                    local_88.span_.size_ = (size_t)pAVar8;
                    testing::internal::CmpHelperEQ<Bytes,Bytes>
                              ((internal *)local_e0,"Bytes(tag)","Bytes(rtag, tag.size())",
                               (Bytes *)local_c0,&local_88);
                    if (local_e0[0] != (internal)0x0) goto LAB_0024ac83;
                    testing::Message::Message((Message *)local_c0);
                    if (local_d8 == (AssertHelperData *)0x0) {
                      pcVar12 = "";
                    }
                    else {
                      pcVar12 = *(char **)local_d8;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_88,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                               ,0x11b,pcVar12);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_88,(Message *)local_c0);
                  }
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
                  auVar10 = local_c0;
                }
                if (auVar10 != (undefined1  [8])0x0) {
                  (**(code **)(*(long *)auVar10 + 8))();
                }
LAB_0024ac83:
                if (local_d8 == (AssertHelperData *)0x0) break;
                pdVar9 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_d8;
              }
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()(pdVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d8);
              break;
            }
            local_c0 = (undefined1  [8])chunk_size;
            if (local_50 < chunk_size) {
              local_c0 = (undefined1  [8])local_50;
            }
            if (chunk_size == 0) {
              local_c0 = (undefined1  [8])local_50;
            }
            local_f8 = (undefined1  [8])0x7fffffff;
            testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
                      ((internal *)local_e0,"todo","static_cast<size_t>(2147483647)",
                       (unsigned_long *)local_c0,(unsigned_long *)local_f8);
            if (local_e0[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_f8);
              pcVar11 = "";
              if (local_d8 != (AssertHelperData *)0x0) {
                pcVar11 = *(char **)local_d8;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_88,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                         ,0xe6,pcVar11);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_88,(Message *)local_f8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
              if (local_f8 != (undefined1  [8])0x0) {
                (**(code **)(*(long *)local_f8 + 8))();
              }
            }
            if (local_d8 != (AssertHelperData *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_d8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_d8);
            }
            bVar2 = MaybeCopyCipherContext(SUB41(local_5c,0),(UniquePtr<EVP_CIPHER_CTX> *)&local_98)
            ;
            local_f8[0] = bVar2;
            local_f0 = (AssertHelperData *)0x0;
            if (bVar2) {
LAB_00249f96:
              if ((char)local_60 == '\0') {
                iVar4 = EVP_CipherUpdate((EVP_CIPHER_CTX *)local_98._M_head_impl,
                                         (uchar *)((long)local_b0 + lVar13),&local_74,
                                         (uchar *)local_58.
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,local_c0._0_4_);
                local_f8[0] = iVar4 != 0;
                local_f0 = (AssertHelperData *)0x0;
                if (iVar4 != 0) goto LAB_0024a127;
                testing::Message::Message((Message *)&local_88);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_e0,(internal *)local_f8,
                           (AssertionResult *)
                           "EVP_CipherUpdate(ctx.get(), result.data() + total, &len, in.data(), static_cast<int>(todo))"
                           ,"false","true",pcVar12);
                testing::internal::AssertHelper::AssertHelper
                          (&local_70,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                           ,0xf4,(char *)CONCAT71(local_e0._1_7_,local_e0[0]));
                testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_88);
                testing::internal::AssertHelper::~AssertHelper(&local_70);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_e0._1_7_,local_e0[0]) != &local_d0) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT71(local_e0._1_7_,local_e0[0]),
                                  local_d0._M_allocated_capacity + 1);
                }
                if ((long *)local_88.span_.data_ != (long *)0x0) {
                  (**(code **)(*(long *)local_88.span_.data_ + 8))();
                }
                if (local_f0 == (AssertHelperData *)0x0) goto LAB_0024a23e;
                pdVar9 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_f0;
                pAVar8 = local_f0;
LAB_0024a239:
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()(pdVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)pAVar8);
                goto LAB_0024a23e;
              }
              if ((local_64 & 1) == 0) {
                local_f8._0_4_ = 1;
                iVar4 = EVP_Cipher((EVP_CIPHER_CTX *)local_98._M_head_impl,
                                   (uchar *)((long)local_b0 + lVar13),
                                   (uchar *)local_58.
                                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl,local_c0._0_4_);
                local_88.span_.data_ = (uchar *)CONCAT44(local_88.span_.data_._4_4_,iVar4);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)local_e0,"1",
                           "EVP_Cipher(ctx.get(), result.data() + total, in.data(), todo)",
                           (int *)local_f8,(int *)&local_88);
                if (local_e0[0] != (internal)0x0) {
                  if (local_d8 != (AssertHelperData *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_d8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_d8);
                  }
                  local_74 = local_c0._0_4_;
                  goto LAB_0024a127;
                }
                testing::Message::Message((Message *)local_f8);
                pcVar11 = "";
                if (local_d8 != (AssertHelperData *)0x0) {
                  pcVar11 = *(char **)local_d8;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_88,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                           ,0xef,pcVar11);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_88,(Message *)local_f8);
LAB_0024a213:
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
                if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                     )local_f8 !=
                    (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  (**(code **)(*(long *)local_f8 + 8))();
                }
                if (local_d8 == (AssertHelperData *)0x0) goto LAB_0024a23e;
                pdVar9 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_d8;
                pAVar8 = local_d8;
                goto LAB_0024a239;
              }
              local_74 = EVP_Cipher((EVP_CIPHER_CTX *)local_98._M_head_impl,
                                    (uchar *)((long)local_b0 + lVar13),
                                    (uchar *)local_58.
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl,local_c0._0_4_);
LAB_0024a127:
              local_f8 = (undefined1  [8])((ulong)local_f8 & 0xffffffff00000000);
              testing::internal::CmpHelperGE<int,int>
                        ((internal *)local_e0,"len","0",&local_74,(int *)local_f8);
              if (local_e0[0] == (internal)0x0) {
                testing::Message::Message((Message *)local_f8);
                pcVar11 = "";
                if (local_d8 != (AssertHelperData *)0x0) {
                  pcVar11 = *(char **)local_d8;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_88,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                           ,0xf6,pcVar11);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_88,(Message *)local_f8);
                goto LAB_0024a213;
              }
              if (local_d8 != (AssertHelperData *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_d8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_d8);
              }
              bVar2 = local_50 < (ulong)local_c0;
              local_50 = (AssertHelperData *)((long)local_50 - (long)local_c0);
              if (bVar2) goto LAB_0024addd;
              local_58.
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    )((long)&((_Alloc_hider *)
                             local_58.
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl)->_M_p + (long)&((_Alloc_hider *)local_c0)->_M_p);
              lVar13 = lVar13 + local_74;
              bVar2 = true;
            }
            else {
              testing::Message::Message((Message *)&local_88);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_e0,(internal *)local_f8,
                         (AssertionResult *)"MaybeCopyCipherContext(copy, &ctx)","false","true",
                         pcVar12);
              testing::internal::AssertHelper::AssertHelper
                        (&local_70,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                         ,0xe7,(char *)CONCAT71(local_e0._1_7_,local_e0[0]));
              testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_88);
              testing::internal::AssertHelper::~AssertHelper(&local_70);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_e0._1_7_,local_e0[0]) != &local_d0) {
                operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT71(local_e0._1_7_,local_e0[0]),
                                local_d0._M_allocated_capacity + 1);
              }
              if ((long *)local_88.span_.data_ != (long *)0x0) {
                (**(code **)(*(long *)local_88.span_.data_ + 8))();
              }
              if (local_f0 != (AssertHelperData *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_f0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_f0);
              }
              if (bVar2) goto LAB_00249f96;
LAB_0024a23e:
              bVar2 = false;
            }
          } while (bVar2);
          if (local_b0 != (undefined1  [8])0x0) {
            operator_delete((void *)local_b0,(long)local_a0 - (long)local_b0);
          }
          goto LAB_00249a1d;
        }
        testing::Message::Message((Message *)local_f8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_e0,(internal *)local_b0,
                   (AssertionResult *)
                   "EVP_CipherInit_ex(ctx.get(), nullptr, nullptr, nullptr, iv.data(), -1)","false",
                   "true",pcVar12);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_c0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                   ,0xb6,(char *)CONCAT71(local_e0._1_7_,local_e0[0]));
        testing::internal::AssertHelper::operator=((AssertHelper *)local_c0,(Message *)local_f8);
        goto LAB_002499d7;
      }
      testing::Message::Message((Message *)local_b0);
      if (local_d8 == (AssertHelperData *)0x0) {
        pcVar12 = "";
      }
      else {
        pcVar12 = *(char **)local_d8;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_f8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0xb2,pcVar12);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_f8,(Message *)local_b0);
    }
LAB_0024a4df:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_f8);
    if (local_b0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b0 + 8))();
    }
    if (local_d8 == (AssertHelperData *)0x0) goto LAB_00249a1d;
    pdVar9 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_d8;
  }
LAB_00249a18:
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(pdVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
LAB_00249a1d:
  std::unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter> *)&local_98);
  return;
}

Assistant:

static void TestCipherAPI(const EVP_CIPHER *cipher, Operation op, bool padding,
                          bool copy, bool in_place, bool use_evp_cipher,
                          size_t chunk_size, bssl::Span<const uint8_t> key,
                          bssl::Span<const uint8_t> iv,
                          bssl::Span<const uint8_t> plaintext,
                          bssl::Span<const uint8_t> ciphertext,
                          bssl::Span<const uint8_t> aad,
                          bssl::Span<const uint8_t> tag) {
  bool encrypt = op == Operation::kEncrypt;
  bool is_custom_cipher =
      EVP_CIPHER_flags(cipher) & EVP_CIPH_FLAG_CUSTOM_CIPHER;
  bssl::Span<const uint8_t> in = encrypt ? plaintext : ciphertext;
  bssl::Span<const uint8_t> expected = encrypt ? ciphertext : plaintext;
  bool is_aead = EVP_CIPHER_mode(cipher) == EVP_CIPH_GCM_MODE;

  // Some |EVP_CIPHER|s take a variable-length key, and need to first be
  // configured with the key length, which requires configuring the cipher.
  bssl::UniquePtr<EVP_CIPHER_CTX> ctx(EVP_CIPHER_CTX_new());
  ASSERT_TRUE(ctx);
  ASSERT_TRUE(EVP_CipherInit_ex(ctx.get(), cipher, /*engine=*/nullptr,
                                /*key=*/nullptr, /*iv=*/nullptr,
                                encrypt ? 1 : 0));
  ASSERT_TRUE(EVP_CIPHER_CTX_set_key_length(ctx.get(), key.size()));
  if (!padding) {
    ASSERT_TRUE(EVP_CIPHER_CTX_set_padding(ctx.get(), 0));
  }

  // Configure the key.
  ASSERT_TRUE(MaybeCopyCipherContext(copy, &ctx));
  ASSERT_TRUE(EVP_CipherInit_ex(ctx.get(), /*cipher=*/nullptr,
                                /*engine=*/nullptr, key.data(), /*iv=*/nullptr,
                                /*enc=*/-1));

  // Configure the IV to run the actual operation. Callers that wish to use a
  // key for multiple, potentially concurrent, operations will likely copy at
  // this point. The |EVP_CIPHER_CTX| API uses the same type to represent a
  // pre-computed key schedule and a streaming operation.
  ASSERT_TRUE(MaybeCopyCipherContext(copy, &ctx));
  if (is_aead) {
    ASSERT_LE(iv.size(), size_t{INT_MAX});
    ASSERT_TRUE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_AEAD_SET_IVLEN,
                                    static_cast<int>(iv.size()), nullptr));
    ASSERT_EQ(EVP_CIPHER_CTX_iv_length(ctx.get()), iv.size());
  } else {
    ASSERT_EQ(iv.size(), EVP_CIPHER_CTX_iv_length(ctx.get()));
  }
  ASSERT_TRUE(EVP_CipherInit_ex(ctx.get(), /*cipher=*/nullptr,
                                /*engine=*/nullptr,
                                /*key=*/nullptr, iv.data(), /*enc=*/-1));

  if (is_aead && !encrypt) {
    ASSERT_TRUE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_AEAD_SET_TAG,
                                    tag.size(),
                                    const_cast<uint8_t *>(tag.data())));
  }

  // Note: the deprecated |EVP_CIPHER|-based AEAD API is sensitive to whether
  // parameters are NULL, so it is important to skip the |in| and |aad|
  // |EVP_CipherUpdate| calls when empty.
  while (!aad.empty()) {
    size_t todo =
        chunk_size == 0 ? aad.size() : std::min(aad.size(), chunk_size);
    if (use_evp_cipher) {
      // AEADs always use the "custom cipher" return value convention. Passing a
      // null output pointer triggers the AAD logic.
      ASSERT_TRUE(is_custom_cipher);
      ASSERT_EQ(static_cast<int>(todo),
                EVP_Cipher(ctx.get(), nullptr, aad.data(), todo));
    } else {
      int len;
      ASSERT_TRUE(EVP_CipherUpdate(ctx.get(), nullptr, &len, aad.data(), todo));
      // Although it doesn't output anything, |EVP_CipherUpdate| should claim to
      // output the input length.
      EXPECT_EQ(len, static_cast<int>(todo));
    }
    aad = aad.subspan(todo);
  }

  // Set up the output buffer.
  size_t max_out = in.size();
  size_t block_size = EVP_CIPHER_CTX_block_size(ctx.get());
  if (block_size > 1 &&
      (EVP_CIPHER_CTX_flags(ctx.get()) & EVP_CIPH_NO_PADDING) == 0 &&
      EVP_CIPHER_CTX_encrypting(ctx.get())) {
    max_out += block_size - (max_out % block_size);
  }
  std::vector<uint8_t> result(max_out);
  if (in_place) {
    std::copy(in.begin(), in.end(), result.begin());
    in = bssl::Span(result).first(in.size());
  }

  size_t total = 0;
  int len;
  while (!in.empty()) {
    size_t todo = chunk_size == 0 ? in.size() : std::min(in.size(), chunk_size);
    EXPECT_LE(todo, static_cast<size_t>(INT_MAX));
    ASSERT_TRUE(MaybeCopyCipherContext(copy, &ctx));
    if (use_evp_cipher) {
      // |EVP_Cipher| sometimes returns the number of bytes written, or -1 on
      // error, and sometimes 1 or 0, implicitly writing |in_len| bytes.
      if (is_custom_cipher) {
        len = EVP_Cipher(ctx.get(), result.data() + total, in.data(), todo);
      } else {
        ASSERT_EQ(
            1, EVP_Cipher(ctx.get(), result.data() + total, in.data(), todo));
        len = static_cast<int>(todo);
      }
    } else {
      ASSERT_TRUE(EVP_CipherUpdate(ctx.get(), result.data() + total, &len,
                                   in.data(), static_cast<int>(todo)));
    }
    ASSERT_GE(len, 0);
    total += static_cast<size_t>(len);
    in = in.subspan(todo);
  }
  if (op == Operation::kInvalidDecrypt) {
    if (use_evp_cipher) {
      // Only the "custom cipher" return value convention can report failures.
      // Passing all nulls should act like |EVP_CipherFinal_ex|.
      ASSERT_TRUE(is_custom_cipher);
      EXPECT_EQ(-1, EVP_Cipher(ctx.get(), nullptr, nullptr, 0));
    } else {
      // Invalid padding and invalid tags all appear as a failed
      // |EVP_CipherFinal_ex|.
      EXPECT_FALSE(EVP_CipherFinal_ex(ctx.get(), result.data() + total, &len));
    }
  } else {
    if (use_evp_cipher) {
      if (is_custom_cipher) {
        // Only the "custom cipher" convention has an |EVP_CipherFinal_ex|
        // equivalent.
        len = EVP_Cipher(ctx.get(), nullptr, nullptr, 0);
      } else {
        len = 0;
      }
    } else {
      ASSERT_TRUE(EVP_CipherFinal_ex(ctx.get(), result.data() + total, &len));
    }
    ASSERT_GE(len, 0);
    total += static_cast<size_t>(len);
    result.resize(total);
    EXPECT_EQ(Bytes(expected), Bytes(result));
    if (encrypt && is_aead) {
      uint8_t rtag[16];
      ASSERT_LE(tag.size(), sizeof(rtag));
      ASSERT_TRUE(MaybeCopyCipherContext(copy, &ctx));
      ASSERT_TRUE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_AEAD_GET_TAG,
                                      tag.size(), rtag));
      EXPECT_EQ(Bytes(tag), Bytes(rtag, tag.size()));
    }
  }
}